

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void done_outputing_bits(char *outfile)

{
  char *outfile_local;
  
  if (bits_to_go2 < 8) {
    outfile[noutchar] = (char)(buffer2 << ((byte)bits_to_go2 & 0x1f));
    if (noutchar < noutmax) {
      noutchar = noutchar + 1;
    }
    bitcount = bits_to_go2 + bitcount;
  }
  return;
}

Assistant:

static void
done_outputing_bits(char *outfile)
{
	if(bits_to_go2 < 8) {
/*		putc(buffer2<<bits_to_go2,outfile); */

	        outfile[noutchar] = (buffer2<<bits_to_go2);
		if (noutchar < noutmax) noutchar++;

		/* count the garbage bits too */
		bitcount += bits_to_go2;
	}
}